

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O3

void __thiscall libtorrent::aux::peer_list::inc_failcount(peer_list *this,torrent_peer *p)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  uVar1 = *(uint *)&p->field_0x1b;
  if ((uVar1 & 0x1f) != 0x1f) {
    if ((((uVar1 & 0x88000020) != 0x20) || (p->connection != (peer_connection_interface *)0x0)) ||
       (((char)uVar1 < '\0' && (*(int *)&this->field_0x60 < 0)))) {
      *(uint *)&p->field_0x1b = uVar1 & 0xffffffe0 | uVar1 + 1 & 0x1f;
      return;
    }
    uVar3 = uVar1 + 1 & 0x1f;
    iVar2 = this->m_max_failcount;
    *(uint *)&p->field_0x1b = uVar1 & 0x77ffffe0 | uVar3;
    if (((int)(uVar1 & 0x1f) < iVar2) &&
       ((*(int *)&this->field_0x60 < 0 && (char)uVar1 < '\0' ||
        (this->m_max_failcount <= (int)uVar3)))) {
      iVar2 = 1;
      if (1 < this->m_num_connect_candidates) {
        iVar2 = this->m_num_connect_candidates;
      }
      this->m_num_connect_candidates = iVar2 + -1;
      return;
    }
  }
  return;
}

Assistant:

void peer_list::inc_failcount(torrent_peer* p)
	{
		INVARIANT_CHECK;
		// failcount is a 5 bit value
		if (p->failcount == 31) return;

		bool const was_conn_cand = is_connect_candidate(*p);
		++p->failcount;
		if (was_conn_cand && !is_connect_candidate(*p))
			update_connect_candidates(-1);
	}